

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O3

void __thiscall
HighsMipSolverData::setCallbackDataOut(HighsMipSolverData *this,double mipsolver_objective_value)

{
  HighsMipSolver *pHVar1;
  HighsCallback *pHVar2;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var3;
  double *mip_rel_gap_00;
  void *__buf;
  double extraout_XMM0_Qa;
  double mip_rel_gap;
  double primal_bound;
  double dual_bound;
  double local_38;
  double local_30;
  double local_28;
  
  mip_rel_gap_00 = &local_38;
  limitsToBounds(this,&local_28,&local_30,mip_rel_gap_00);
  HighsTimer::read(&this->mipsolver->timer_,0,__buf,(size_t)mip_rel_gap_00);
  pHVar1 = this->mipsolver;
  pHVar2 = pHVar1->callback_;
  (pHVar2->data_out).running_time = extraout_XMM0_Qa;
  (pHVar2->data_out).objective_function_value = mipsolver_objective_value;
  _Var3._M_head_impl =
       (pHVar1->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  (pHVar2->data_out).mip_node_count = (_Var3._M_head_impl)->num_nodes;
  (pHVar2->data_out).mip_total_lp_iterations = (_Var3._M_head_impl)->total_lp_iterations;
  (pHVar2->data_out).mip_primal_bound = local_30;
  (pHVar2->data_out).mip_dual_bound = local_28;
  (pHVar2->data_out).mip_gap = local_38;
  return;
}

Assistant:

void HighsMipSolverData::setCallbackDataOut(
    const double mipsolver_objective_value) const {
  double dual_bound;
  double primal_bound;
  double mip_rel_gap;
  limitsToBounds(dual_bound, primal_bound, mip_rel_gap);
  mipsolver.callback_->data_out.running_time = mipsolver.timer_.read();
  mipsolver.callback_->data_out.objective_function_value =
      mipsolver_objective_value;
  mipsolver.callback_->data_out.mip_node_count = mipsolver.mipdata_->num_nodes;
  mipsolver.callback_->data_out.mip_total_lp_iterations =
      mipsolver.mipdata_->total_lp_iterations;
  mipsolver.callback_->data_out.mip_primal_bound = primal_bound;
  mipsolver.callback_->data_out.mip_dual_bound = dual_bound;
  mipsolver.callback_->data_out.mip_gap = mip_rel_gap;
}